

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::ComputeObjectMaxPath(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_380;
  ostringstream local_360 [8];
  ostringstream w_1;
  string local_1e8;
  ostringstream local_1c8 [8];
  ostringstream w;
  uint local_50 [2];
  uint pmax;
  allocator local_39;
  string local_38;
  char *local_18;
  char *plen;
  cmLocalGenerator *this_local;
  
  this->ObjectPathMax = 1000;
  this_00 = this->Makefile;
  plen = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_OBJECT_PATH_MAX",&local_39);
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pcVar2;
  if ((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) {
    iVar1 = __isoc99_sscanf(pcVar2,"%u",local_50);
    if (iVar1 == 1) {
      if (local_50[0] < 0x80) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar3 = std::operator<<((ostream *)local_1c8,"CMAKE_OBJECT_PATH_MAX is set to ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_50[0]);
        poVar3 = std::operator<<(poVar3,", which is less than the minimum of 128.  ");
        std::operator<<(poVar3,"The value will be ignored.");
        std::__cxx11::ostringstream::str();
        IssueMessage(this,AUTHOR_WARNING,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream(local_1c8);
      }
      else {
        this->ObjectPathMax = (ulong)local_50[0];
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar3 = std::operator<<((ostream *)local_360,"CMAKE_OBJECT_PATH_MAX is set to \"");
      poVar3 = std::operator<<(poVar3,local_18);
      poVar3 = std::operator<<(poVar3,"\", which fails to parse as a positive integer.  ");
      std::operator<<(poVar3,"The value will be ignored.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,AUTHOR_WARNING,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->ObjectMaxPathViolations);
  return;
}

Assistant:

void cmLocalGenerator::ComputeObjectMaxPath()
{
// Choose a maximum object file name length.
#if defined(_WIN32) || defined(__CYGWIN__)
  this->ObjectPathMax = 250;
#else
  this->ObjectPathMax = 1000;
#endif
  const char* plen = this->Makefile->GetDefinition("CMAKE_OBJECT_PATH_MAX");
  if (plen && *plen) {
    unsigned int pmax;
    if (sscanf(plen, "%u", &pmax) == 1) {
      if (pmax >= 128) {
        this->ObjectPathMax = pmax;
      } else {
        std::ostringstream w;
        w << "CMAKE_OBJECT_PATH_MAX is set to " << pmax
          << ", which is less than the minimum of 128.  "
          << "The value will be ignored.";
        this->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      }
    } else {
      std::ostringstream w;
      w << "CMAKE_OBJECT_PATH_MAX is set to \"" << plen
        << "\", which fails to parse as a positive integer.  "
        << "The value will be ignored.";
      this->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }
  }
  this->ObjectMaxPathViolations.clear();
}